

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

void Curl_cf_http_proxy_get_host
               (Curl_cfilter *cf,Curl_easy *data,char **phost,char **pdisplay_host,int *pport)

{
  if ((cf->field_0x24 & 1) == 0) {
    *phost = (cf->conn->http_proxy).host.name;
    *pdisplay_host = (cf->conn->http_proxy).host.dispname;
    *pport = (cf->conn->http_proxy).port;
    return;
  }
  (*cf->next->cft->get_host)(cf->next,data,phost,pdisplay_host,pport);
  return;
}

Assistant:

void Curl_cf_http_proxy_get_host(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 const char **phost,
                                 const char **pdisplay_host,
                                 int *pport)
{
  (void)data;
  if(!cf->connected) {
    *phost = cf->conn->http_proxy.host.name;
    *pdisplay_host = cf->conn->http_proxy.host.dispname;
    *pport = (int)cf->conn->http_proxy.port;
  }
  else {
    cf->next->cft->get_host(cf->next, data, phost, pdisplay_host, pport);
  }
}